

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_extension_c_test.cc
# Opt level: O0

void TestNewHook(void *ptr,size_t size)

{
  bool bVar1;
  char *message;
  AssertHelper local_80;
  Message local_78 [3];
  int local_60;
  int local_5c;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  void *result [5];
  size_t size_local;
  void *ptr_local;
  
  local_5c = MallocHook_GetCallerStackTrace(&gtest_ar.message_,5,0);
  local_60 = 2;
  testing::internal::CmpHelperLE<int,int>
            ((internal *)local_58,
             "MallocHook_GetCallerStackTrace( result, sizeof(result)/sizeof(*result), 0)","2",
             &local_5c,&local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(local_78);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/malloc_extension_c_test.cc"
               ,0x3b,message);
    testing::internal::AssertHelper::operator=(&local_80,local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::Message::~Message(local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  if (bVar1) {
    g_new_hook_calls = g_new_hook_calls + 1;
  }
  return;
}

Assistant:

void TestNewHook(const void* ptr, size_t size) {
  void* result[5];

  ASSERT_LE(MallocHook_GetCallerStackTrace(
              result,
              sizeof(result)/sizeof(*result), 0),
            2);

  g_new_hook_calls++;
}